

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

int __thiscall application::Chat::getConsoleWidth(Chat *this)

{
  winsize w;
  undefined1 local_10 [2];
  ushort local_e;
  
  ioctl(1,0x5413,local_10);
  return (int)local_e;
}

Assistant:

int Chat::getConsoleWidth()
{
#ifdef _WIN32
	HANDLE hWndConsole;
	hWndConsole = GetStdHandle(-12);
	CONSOLE_SCREEN_BUFFER_INFO sbi;
	GetConsoleScreenBufferInfo(hWndConsole, &sbi);
	return sbi.srWindow.Right - sbi.srWindow.Left + 1;
#else
	struct winsize w;
	ioctl(STDOUT_FILENO, TIOCGWINSZ, &w);
	return w.winsize::ws_col;
#endif
}